

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O0

uint64_t helper_bfextu_mem_m68k(CPUM68KState_conflict *env,uint32_t addr,int32_t ofs,uint32_t len)

{
  uint64_t uVar1;
  ulong uVar2;
  bf_data bVar3;
  uintptr_t unaff_retaddr;
  uint64_t data;
  bf_data d;
  uintptr_t ra;
  uint32_t len_local;
  int32_t ofs_local;
  uint32_t addr_local;
  CPUM68KState_conflict *env_local;
  
  bVar3 = bf_prep(addr,ofs,len);
  data._0_4_ = bVar3.addr;
  d.addr = bVar3.blen;
  uVar1 = bf_load(env,(uint32_t)data,d.addr,unaff_retaddr);
  uVar2 = (uVar1 << ((byte)bVar3.bofs & 0x3f)) >> (0x40U - (char)bVar3.len & 0x3f);
  return uVar2 << (0x40U - (char)bVar3.len & 0x3f) | uVar2;
}

Assistant:

uint64_t HELPER(bfextu_mem)(CPUM68KState *env, uint32_t addr,
                            int32_t ofs, uint32_t len)
{
    uintptr_t ra = GETPC();
    struct bf_data d = bf_prep(addr, ofs, len);
    uint64_t data = bf_load(env, d.addr, d.blen, ra);

    /*
     * Put CC_N at the top of the high word; put the zero-extended value
     * at the bottom of the low word.
     */
    data <<= d.bofs;
    data >>= 64 - d.len;
    data |= data << (64 - d.len);

    return data;
}